

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  Table *events;
  global_State *pgVar2;
  Value *pVVar3;
  TValue *pTVar4;
  Value *pVVar5;
  int iVar6;
  StkId pTVar7;
  TValue *o2_1;
  TValue *o1;
  bool bVar8;
  TValue temp;
  
  iVar6 = 100;
  do {
    bVar8 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar8) {
      luaG_runerror(L,"loop in settable");
    }
    if (t->tt == 5) {
      t_00 = (t->value).gc;
      pTVar4 = luaH_set(L,&t_00->h,key);
      if (((pTVar4->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
         ((events->flags & 2) != 0)) {
LAB_00106d3d:
        pTVar4->value = val->value;
        iVar6 = val->tt;
        pTVar4->tt = iVar6;
        (t_00->h).flags = '\0';
        if (((3 < iVar6) && (((((val->value).gc)->gch).marked & 3) != 0)) &&
           (((t_00->gch).marked & 4) != 0)) {
          pgVar2 = L->l_G;
          (t_00->gch).marked = (t_00->gch).marked & 0xfb;
          (t_00->h).gclist = pgVar2->grayagain;
          pgVar2->grayagain = t_00;
        }
        return;
      }
      pVVar5 = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value;
      if (pVVar5 == (Value *)0x0) goto LAB_00106d3d;
      iVar1 = pVVar5[1].b;
    }
    else {
      pVVar5 = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      iVar1 = pVVar5[1].b;
      if (iVar1 == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    if (iVar1 == 6) {
      pVVar3 = &L->top->value;
      *pVVar3 = *pVVar5;
      pVVar3[1].b = pVVar5[1].b;
      pTVar7 = L->top;
      pTVar7[1].value = t->value;
      pTVar7[1].tt = t->tt;
      pTVar7 = L->top;
      pTVar7[2].value = key->value;
      pTVar7[2].tt = key->tt;
      pTVar7 = L->top;
      pTVar7[3].value = val->value;
      pTVar7[3].tt = val->tt;
      pTVar7 = L->top;
      if ((long)L->stack_last - (long)pTVar7 < 0x41) {
        luaD_growstack(L,4);
        pTVar7 = L->top;
      }
      L->top = pTVar7 + 4;
      luaD_call(L,pTVar7,0);
      return;
    }
    temp.value = *pVVar5;
    temp.tt = iVar1;
    t = &temp;
  } while( true );
}

Assistant:

static void luaV_settable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
TValue temp;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
TValue*oldval=luaH_set(L,h,key);
if(!ttisnil(oldval)||
(tm=fasttm(L,h->metatable,TM_NEWINDEX))==NULL){
setobj(L,oldval,val);
h->flags=0;
luaC_barriert(L,h,val);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_NEWINDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTM(L,tm,t,key,val);
return;
}
setobj(L,&temp,tm);
t=&temp;
}
luaG_runerror(L,"loop in settable");
}